

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

SQInteger __thiscall SQFuncState::GetLocalVariable(SQFuncState *this,SQObject *name)

{
  SQUnsignedInteger SVar1;
  SQObjectValue *pSVar2;
  
  SVar1 = (this->_vlocals)._size;
  pSVar2 = &(this->_vlocals)._vals[SVar1 - 1]._name.super_SQObject._unVal;
  while( true ) {
    if ((long)SVar1 < 1) {
      return -1;
    }
    if ((((SQObject *)(pSVar2 + -1))->_type == OT_STRING) &&
       (pSVar2->pTable == (name->_unVal).pTable)) break;
    pSVar2 = pSVar2 + -5;
    SVar1 = SVar1 - 1;
  }
  return SVar1 - 1;
}

Assistant:

SQInteger SQFuncState::GetLocalVariable(const SQObject &name)
{
    SQInteger locals=_vlocals.size();
    while(locals>=1){
        SQLocalVarInfo &lvi = _vlocals[locals-1];
        if(sq_type(lvi._name)==OT_STRING && _string(lvi._name)==_string(name)){
            return locals-1;
        }
        locals--;
    }
    return -1;
}